

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriConnectivity.cc
# Opt level: O0

bool __thiscall OpenMesh::TriConnectivity::is_collapse_ok(TriConnectivity *this,HalfedgeHandle v0v1)

{
  bool bVar1;
  EdgeHandle _eh;
  HalfedgeHandle _heh;
  VertexHandle _vh;
  VertexHandle _vh_00;
  HalfedgeHandle HVar2;
  StatusInfo *pSVar3;
  bool local_143;
  bool local_142;
  bool local_141;
  BaseHandle local_128;
  BaseHandle local_124;
  BaseHandle local_120;
  BaseHandle local_11c;
  VertexVertexIter local_118;
  BaseHandle local_100;
  BaseHandle local_fc;
  VertexVertexIter local_f8;
  BaseHandle local_e0;
  BaseHandle local_dc;
  VertexVertexIter local_d8;
  undefined1 local_c0 [8];
  VertexVertexIter vv_it;
  BaseHandle local_50;
  BaseHandle local_4c;
  HalfedgeHandle h2;
  HalfedgeHandle h1;
  VertexHandle vr;
  VertexHandle vl;
  VertexHandle v1;
  VertexHandle v0;
  HalfedgeHandle v1v0;
  TriConnectivity *this_local;
  HalfedgeHandle v0v1_local;
  
  _eh = ArrayKernel::edge_handle((ArrayKernel *)this,v0v1);
  pSVar3 = ArrayKernel::status((ArrayKernel *)this,_eh);
  bVar1 = Attributes::StatusInfo::deleted(pSVar3);
  if (!bVar1) {
    _heh = ArrayKernel::opposite_halfedge_handle((ArrayKernel *)this,v0v1);
    _vh = ArrayKernel::to_vertex_handle((ArrayKernel *)this,_heh);
    _vh_00 = ArrayKernel::to_vertex_handle((ArrayKernel *)this,v0v1);
    pSVar3 = ArrayKernel::status((ArrayKernel *)this,_vh);
    bVar1 = Attributes::StatusInfo::deleted(pSVar3);
    if (!bVar1) {
      pSVar3 = ArrayKernel::status((ArrayKernel *)this,_vh_00);
      bVar1 = Attributes::StatusInfo::deleted(pSVar3);
      if (!bVar1) {
        VertexHandle::VertexHandle((VertexHandle *)&h1,-1);
        VertexHandle::VertexHandle((VertexHandle *)&h2,-1);
        HalfedgeHandle::HalfedgeHandle((HalfedgeHandle *)&local_4c,-1);
        HalfedgeHandle::HalfedgeHandle((HalfedgeHandle *)&local_50,-1);
        bVar1 = PolyConnectivity::is_boundary(&this->super_PolyConnectivity,v0v1);
        if (!bVar1) {
          local_4c.idx_ = (int)ArrayKernel::next_halfedge_handle((ArrayKernel *)this,v0v1);
          local_50.idx_ =
               (int)ArrayKernel::next_halfedge_handle
                              ((ArrayKernel *)this,(HalfedgeHandle)local_4c.idx_);
          h1.super_BaseHandle.idx_ =
               (BaseHandle)
               ArrayKernel::to_vertex_handle((ArrayKernel *)this,(HalfedgeHandle)local_4c.idx_);
          HVar2 = ArrayKernel::opposite_halfedge_handle
                            ((ArrayKernel *)this,(HalfedgeHandle)local_4c.idx_);
          bVar1 = PolyConnectivity::is_boundary(&this->super_PolyConnectivity,HVar2);
          local_141 = false;
          if (bVar1) {
            HVar2 = ArrayKernel::opposite_halfedge_handle
                              ((ArrayKernel *)this,(HalfedgeHandle)local_50.idx_);
            local_141 = PolyConnectivity::is_boundary(&this->super_PolyConnectivity,HVar2);
          }
          if (local_141 != false) {
            return false;
          }
        }
        bVar1 = PolyConnectivity::is_boundary(&this->super_PolyConnectivity,_heh);
        if (!bVar1) {
          local_4c.idx_ = (int)ArrayKernel::next_halfedge_handle((ArrayKernel *)this,_heh);
          local_50.idx_ =
               (int)ArrayKernel::next_halfedge_handle
                              ((ArrayKernel *)this,(HalfedgeHandle)local_4c.idx_);
          h2.super_BaseHandle.idx_ =
               (BaseHandle)
               ArrayKernel::to_vertex_handle((ArrayKernel *)this,(HalfedgeHandle)local_4c.idx_);
          HVar2 = ArrayKernel::opposite_halfedge_handle
                            ((ArrayKernel *)this,(HalfedgeHandle)local_4c.idx_);
          bVar1 = PolyConnectivity::is_boundary(&this->super_PolyConnectivity,HVar2);
          local_142 = false;
          if (bVar1) {
            vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ =
                 local_50.idx_;
            vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ =
                 ArrayKernel::opposite_halfedge_handle
                           ((ArrayKernel *)this,(HalfedgeHandle)local_50.idx_);
            local_142 = PolyConnectivity::is_boundary
                                  (&this->super_PolyConnectivity,
                                   (HalfedgeHandle)
                                   vv_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.
                                   _20_4_);
          }
          if (local_142 != false) {
            return false;
          }
        }
        bVar1 = BaseHandle::operator==(&h1.super_BaseHandle,&h2.super_BaseHandle);
        if (bVar1) {
          return false;
        }
        Iterators::
        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
        ::GenericCirculatorT
                  ((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    *)local_c0);
        local_dc = _vh.super_BaseHandle.idx_;
        PolyConnectivity::vv_iter(&local_d8,&this->super_PolyConnectivity,_vh);
        Iterators::
        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
        ::operator=((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                     *)local_c0,&local_d8);
        while (bVar1 = Iterators::
                       GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                       ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                   *)local_c0), bVar1) {
          local_e0.idx_ =
               (int)Iterators::
                    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                 *)local_c0);
          pSVar3 = ArrayKernel::status((ArrayKernel *)this,(VertexHandle)local_e0.idx_);
          Attributes::StatusInfo::set_tagged(pSVar3,false);
          Iterators::
          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
          ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                        *)local_c0);
        }
        local_fc = _vh_00.super_BaseHandle.idx_;
        PolyConnectivity::vv_iter(&local_f8,&this->super_PolyConnectivity,_vh_00);
        Iterators::
        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
        ::operator=((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                     *)local_c0,&local_f8);
        while (bVar1 = Iterators::
                       GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                       ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                   *)local_c0), bVar1) {
          local_100.idx_ =
               (int)Iterators::
                    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                 *)local_c0);
          pSVar3 = ArrayKernel::status((ArrayKernel *)this,(VertexHandle)local_100.idx_);
          Attributes::StatusInfo::set_tagged(pSVar3,true);
          Iterators::
          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
          ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                        *)local_c0);
        }
        local_11c = _vh.super_BaseHandle.idx_;
        PolyConnectivity::vv_iter(&local_118,&this->super_PolyConnectivity,_vh);
        Iterators::
        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
        ::operator=((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                     *)local_c0,&local_118);
        while( true ) {
          bVar1 = Iterators::
                  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                  ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                              *)local_c0);
          if (!bVar1) {
            bVar1 = PolyConnectivity::is_boundary(&this->super_PolyConnectivity,_vh);
            if ((((bVar1) &&
                 (bVar1 = PolyConnectivity::is_boundary(&this->super_PolyConnectivity,_vh_00), bVar1
                 )) && (bVar1 = PolyConnectivity::is_boundary(&this->super_PolyConnectivity,v0v1),
                       !bVar1)) &&
               (bVar1 = PolyConnectivity::is_boundary(&this->super_PolyConnectivity,_heh), !bVar1))
            {
              return false;
            }
            return true;
          }
          local_120.idx_ =
               (int)Iterators::
                    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                    ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                 *)local_c0);
          pSVar3 = ArrayKernel::status((ArrayKernel *)this,(VertexHandle)local_120.idx_);
          bVar1 = Attributes::StatusInfo::tagged(pSVar3);
          local_143 = false;
          if (bVar1) {
            local_124.idx_ =
                 (int)Iterators::
                      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                      ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                   *)local_c0);
            bVar1 = BaseHandle::operator!=(&local_124,&h1.super_BaseHandle);
            local_143 = false;
            if (bVar1) {
              local_128.idx_ =
                   (int)Iterators::
                        GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                        ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                                     *)local_c0);
              local_143 = BaseHandle::operator!=(&local_128,&h2.super_BaseHandle);
            }
          }
          if (local_143 != false) break;
          Iterators::
          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
          ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                        *)local_c0);
        }
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool TriConnectivity::is_collapse_ok(HalfedgeHandle v0v1)
{
  // is the edge already deleted?
  if ( status(edge_handle(v0v1)).deleted() )
    return false;

  HalfedgeHandle  v1v0(opposite_halfedge_handle(v0v1));
  VertexHandle    v0(to_vertex_handle(v1v0));
  VertexHandle    v1(to_vertex_handle(v0v1));

  // are vertices already deleted ?
  if (status(v0).deleted() || status(v1).deleted())
    return false;

  VertexHandle    vl, vr;
  HalfedgeHandle  h1, h2;

  // the edges v1-vl and vl-v0 must not be both boundary edges
  if (!is_boundary(v0v1))
  {

    h1 = next_halfedge_handle(v0v1);
    h2 = next_halfedge_handle(h1);

    vl = to_vertex_handle(h1);

    if (is_boundary(opposite_halfedge_handle(h1)) &&
        is_boundary(opposite_halfedge_handle(h2)))
    {
      return false;
    }
  }


  // the edges v0-vr and vr-v1 must not be both boundary edges
  if (!is_boundary(v1v0))
  {

    h1 = next_halfedge_handle(v1v0);
    h2 = next_halfedge_handle(h1);

    vr = to_vertex_handle(h1);

    if (is_boundary(opposite_halfedge_handle(h1)) &&
        is_boundary(opposite_halfedge_handle(h2)))
      return false;
  }

  // if vl and vr are equal or both invalid -> fail
  if (vl == vr) return false;

  VertexVertexIter  vv_it;

  // test intersection of the one-rings of v0 and v1
  for (vv_it = vv_iter(v0); vv_it.is_valid(); ++vv_it)
    status(*vv_it).set_tagged(false);

  for (vv_it = vv_iter(v1); vv_it.is_valid(); ++vv_it)
    status(*vv_it).set_tagged(true);

  for (vv_it = vv_iter(v0); vv_it.is_valid(); ++vv_it)
    if (status(*vv_it).tagged() && *vv_it != vl && *vv_it != vr)
      return false;


  // edge between two boundary vertices should be a boundary edge
  if ( is_boundary(v0) && is_boundary(v1) &&
       !is_boundary(v0v1) && !is_boundary(v1v0))
    return false;

  // passed all tests
  return true;
}